

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::(anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,uint128 v,fmtflags flags)

{
  uint *puVar1;
  long lVar2;
  uint128 dividend;
  char cVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint128 dividend_00;
  uint128 divisor;
  uint128 divisor_00;
  uint128 mid;
  uint128 low;
  ostringstream os;
  undefined1 auStack_1e8 [8];
  undefined8 local_1e0;
  uint128 local_1d8;
  uint128 local_1c8;
  uint128 local_1b8;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  uVar4 = (uint)v.hi_ & 0x4a;
  if (uVar4 == 8) {
    local_1e0 = 0xf;
    uVar6 = 0x1000000000000000;
  }
  else if (uVar4 == 0x40) {
    local_1e0 = 0x15;
    uVar6 = 0x8000000000000000;
  }
  else {
    local_1e0 = 0x13;
    uVar6 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffbdb5 |
       (uint)v.hi_ & 0x424a;
  dividend_00.hi_ = v.lo_;
  dividend_00.lo_ = (uint64_t)this;
  divisor.hi_ = 0;
  divisor.lo_ = uVar6;
  local_1b8.lo_ = (uint64_t)this;
  local_1b8.hi_ = v.lo_;
  anon_unknown_2::DivModImpl(dividend_00,divisor,&local_1b8,&local_1c8);
  dividend.hi_ = local_1b8.hi_;
  dividend.lo_ = local_1b8.lo_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar6;
  anon_unknown_2::DivModImpl(dividend,divisor_00,&local_1b8,&local_1d8);
  if ((void *)local_1b8.lo_ == (void *)0x0) {
    if (local_1d8.lo_ == 0) goto LAB_002e2d2f;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    uVar5 = local_1e0;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar2 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar2 + 1] == '\0') {
      cVar3 = std::ios::widen((char)auStack_1e8 + (char)lVar2 + '@');
      acStack_c8[lVar2] = cVar3;
      acStack_c8[lVar2 + 1] = '\x01';
    }
    acStack_c8[lVar2] = '0';
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    uVar5 = local_1e0;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar2 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar2 + 1] == '\0') {
      cVar3 = std::ios::widen((char)auStack_1e8 + (char)lVar2 + '@');
      acStack_c8[lVar2] = cVar3;
      acStack_c8[lVar2 + 1] = '\x01';
    }
    acStack_c8[lVar2] = '0';
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar5;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar5;
LAB_002e2d2f:
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Uint128ToFormattedString(uint128 v, std::ios_base::fmtflags flags) {
  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  int div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div = 0x1000000000000000;  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = 01000000000000000000000;  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = 10000000000000000000u;  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of the
  // original value, each less than "div" and therefore representable as a
  // uint64_t.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = v;
  uint128 low;
  DivModImpl(high, div, &high, &low);
  uint128 mid;
  DivModImpl(high, div, &high, &mid);
  if (Uint128Low64(high) != 0) {
    os << Uint128Low64(high);
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << Uint128Low64(mid);
    os << std::setw(div_base_log);
  } else if (Uint128Low64(mid) != 0) {
    os << Uint128Low64(mid);
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << Uint128Low64(low);
  return os.str();
}